

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_fader_init(ma_fader_config *pConfig,ma_fader *pFader)

{
  ma_uint32 mVar1;
  ma_fader *pFader_local;
  ma_fader_config *pConfig_local;
  
  if (pFader == (ma_fader *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pFader,0,0x28);
    if (pConfig == (ma_fader_config *)0x0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (pConfig->format == ma_format_f32) {
      mVar1 = pConfig->channels;
      (pFader->config).format = pConfig->format;
      (pFader->config).channels = mVar1;
      (pFader->config).sampleRate = pConfig->sampleRate;
      pFader->volumeBeg = 1.0;
      pFader->volumeEnd = 1.0;
      pFader->lengthInFrames = 0;
      pFader->cursorInFrames = 0;
      pConfig_local._4_4_ = MA_SUCCESS;
    }
    else {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_fader_init(const ma_fader_config* pConfig, ma_fader* pFader)
{
    if (pFader == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFader);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only f32 is supported for now. */
    if (pConfig->format != ma_format_f32) {
        return MA_INVALID_ARGS;
    }

    pFader->config         = *pConfig;
    pFader->volumeBeg      = 1;
    pFader->volumeEnd      = 1;
    pFader->lengthInFrames = 0;
    pFader->cursorInFrames = 0;

    return MA_SUCCESS;
}